

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O0

loc_conflict origin_get_loc(source origin)

{
  monster_conflict *pmVar1;
  trap *trap;
  monster *who;
  source origin_local;
  
  switch(origin.what) {
  case SRC_NONE:
    origin_local.which = (anon_union_8_4_b62eeb40_for_which_conflict)loc(-1,-1);
    break;
  case SRC_TRAP:
    origin_local.which = *(anon_union_8_4_b62eeb40_for_which_conflict *)&(origin.which.trap)->grid;
    break;
  case SRC_PLAYER:
  case SRC_OBJECT:
  case SRC_CHEST_TRAP:
    origin_local.which = *(anon_union_8_4_b62eeb40_for_which_conflict *)&player->grid;
    break;
  case SRC_MONSTER:
    origin_local.what = origin.which._0_4_;
    pmVar1 = cave_monster(cave,origin_local.what);
    if (pmVar1 == (monster_conflict *)0x0) {
      origin_local.which = (anon_union_8_4_b62eeb40_for_which_conflict)loc(-1,-1);
    }
    else {
      origin_local.which = *(anon_union_8_4_b62eeb40_for_which_conflict *)&pmVar1->grid;
    }
    break;
  default:
    origin_local.which = (anon_union_8_4_b62eeb40_for_which_conflict)loc(-1,-1);
  }
  return (loc_conflict)origin_local.which.trap;
}

Assistant:

struct loc origin_get_loc(struct source origin)
{
	switch (origin.what) {
		case SRC_MONSTER: {
			struct monster *who = cave_monster(cave, origin.which.monster);
			return who ? who->grid : loc(-1, -1);
		}

		case SRC_TRAP: {
			struct trap *trap = origin.which.trap;
			return trap->grid;
		}

		case SRC_PLAYER:
		case SRC_OBJECT:	/* Currently only worn cursed objects use this */
		case SRC_CHEST_TRAP:
			return player->grid;

		case SRC_NONE:
			return loc(-1, -1);
	}

	return loc(-1, -1);
}